

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFParser.cc
# Opt level: O3

void __thiscall QPDFParser::add(QPDFParser *this,shared_ptr<QPDFObject> *obj)

{
  StackFrame *this_00;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_bool>
  pVar1;
  
  this_00 = this->frame;
  if (this_00->state == st_dictionary_value) {
    pVar1 = std::
            map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
            ::insert_or_assign<std::shared_ptr<QPDFObject>>
                      ((map<std::__cxx11::string,QPDFObjectHandle,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,QPDFObjectHandle>>>
                        *)&this_00->dict,&this_00->key,obj);
    if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      warnDuplicateKey(this);
    }
    this->frame->state = st_dictionary_key;
    return;
  }
  std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  emplace_back<std::shared_ptr<QPDFObject>>
            ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)this_00,obj);
  return;
}

Assistant:

void
QPDFParser::add(std::shared_ptr<QPDFObject>&& obj)
{
    if (frame->state != st_dictionary_value) {
        // If state is st_dictionary_key then there is a missing key. Push onto olist for
        // processing once the tt_dict_close token has been found.
        frame->olist.emplace_back(std::move(obj));
    } else {
        if (auto res = frame->dict.insert_or_assign(frame->key, std::move(obj)); !res.second) {
            warnDuplicateKey();
        }
        frame->state = st_dictionary_key;
    }
}